

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

String * __thiscall asl::File::name(String *__return_storage_ptr__,File *this)

{
  int iVar1;
  
  iVar1 = String::lastIndexOf(&this->_path,'/');
  String::substring(__return_storage_ptr__,&this->_path,iVar1 + 1);
  return __return_storage_ptr__;
}

Assistant:

String File::name() const
{
	int n = _path.lastIndexOf(SEP);
#ifdef _WIN32
	int m = _path.lastIndexOf('/');
	n = (m > n)? m : n;
#endif
	return _path.substring(n+1);
}